

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIScrollBar::setMin(CGUIScrollBar *this,s32 min)

{
  int iVar1;
  ulong uVar2;
  
  this->Min = min;
  iVar1 = this->Max;
  if (this->Max < min) {
    this->Max = min;
    iVar1 = min;
  }
  uVar2 = (ulong)(1e-06 < ABS((float)(iVar1 - min)));
  (*(this->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
            (this->UpButton,uVar2);
  (*(this->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
            (this->DownButton,uVar2);
  (**(code **)(*(long *)this + 0x168))(this,this->Pos);
  return;
}

Assistant:

void CGUIScrollBar::setMin(s32 min)
{
	Min = min;
	if (Max < Min)
		Max = Min;

	bool enable = core::isnotzero(range());
	UpButton->setEnabled(enable);
	DownButton->setEnabled(enable);
	setPos(Pos);
}